

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::Utils::program::getBinary
          (program *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *binary,
          GLenum *binary_format)

{
  GLuint GVar1;
  code *pcVar2;
  Functions *pFVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_type sVar7;
  reference pvVar8;
  int local_2c;
  long lStack_28;
  GLint length;
  Functions *gl;
  GLenum *binary_format_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *binary_local;
  program *this_local;
  
  gl = (Functions *)binary_format;
  binary_format_local = (GLenum *)binary;
  binary_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  pRVar6 = deqp::Context::getRenderContext(this->m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar4);
  local_2c = 0;
  (**(code **)(lStack_28 + 0x9d8))(this->m_program_object_id,0x8741,&local_2c);
  dVar5 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar5,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1aa);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)binary_format_local,
             (long)local_2c);
  pcVar2 = *(code **)(lStack_28 + 0x980);
  GVar1 = this->m_program_object_id;
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)binary_format_local);
  pFVar3 = gl;
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)binary_format_local,0
                     );
  (*pcVar2)(GVar1,sVar7 & 0xffffffff,&local_2c,pFVar3,pvVar8);
  dVar5 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar5,"GetProgramBinary",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b1);
  return;
}

Assistant:

void Utils::program::getBinary(std::vector<GLubyte>& binary, GLenum& binary_format) const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get binary size */
	GLint length = 0;
	gl.getProgramiv(m_program_object_id, GL_PROGRAM_BINARY_LENGTH, &length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Allocate storage */
	binary.resize(length);

	/* Get binary */
	gl.getProgramBinary(m_program_object_id, (GLsizei)binary.size(), &length, &binary_format, &binary[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramBinary");
}